

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  u32 uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  SrcList *pSVar5;
  char *pcVar6;
  ExprList *pEVar7;
  Select *pSVar8;
  Expr *pEVar9;
  long lVar10;
  long lVar11;
  
  if (p != (SrcList *)0x0) {
    iVar4 = 0x70;
    if (0 < p->nSrc) {
      iVar4 = p->nSrc * 0x68 + 8;
    }
    pSVar5 = (SrcList *)sqlite3DbMallocRawNN(db,(long)iVar4);
    if (pSVar5 != (SrcList *)0x0) {
      uVar1 = p->nSrc;
      pSVar5->nAlloc = uVar1;
      pSVar5->nSrc = uVar1;
      if (p->nSrc < 1) {
        return pSVar5;
      }
      lVar11 = 0x68;
      lVar10 = 0;
      do {
        *(undefined8 *)((long)(pSVar5->a + -1) + lVar11) =
             *(undefined8 *)((long)(p->a + -1) + lVar11);
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x60));
        *(char **)((long)pSVar5->a + lVar11 + -0x60) = pcVar6;
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x58));
        *(char **)((long)pSVar5->a + lVar11 + -0x58) = pcVar6;
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x50));
        *(char **)((long)pSVar5->a + lVar11 + -0x50) = pcVar6;
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x2c) =
             *(undefined4 *)((long)p->a + lVar11 + -0x2c);
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x28) =
             *(undefined4 *)((long)p->a + lVar11 + -0x28);
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x38) =
             *(undefined4 *)((long)p->a + lVar11 + -0x38);
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x34) =
             *(undefined4 *)((long)p->a + lVar11 + -0x34);
        if ((*(byte *)((long)pSVar5->a + lVar11 + -0x2b) & 2) != 0) {
          pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x10));
          *(char **)((long)pSVar5->a + lVar11 + -0x10) = pcVar6;
        }
        *(undefined8 *)((long)pSVar5->a + lVar11 + -8) = *(undefined8 *)((long)p->a + lVar11 + -8);
        if ((*(byte *)((long)pSVar5->a + lVar11 + -0x2a) & 1) != 0) {
          piVar2 = *(int **)((long)pSVar5->a + lVar11 + -8);
          *piVar2 = *piVar2 + 1;
        }
        if ((*(byte *)((long)pSVar5->a + lVar11 + -0x2b) & 4) != 0) {
          pEVar7 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar11 + -0x10),flags);
          *(ExprList **)((long)pSVar5->a + lVar11 + -0x10) = pEVar7;
        }
        lVar3 = *(long *)((long)p->a + lVar11 + -0x48);
        *(long *)((long)pSVar5->a + lVar11 + -0x48) = lVar3;
        if (lVar3 != 0) {
          *(int *)(lVar3 + 0x2c) = *(int *)(lVar3 + 0x2c) + 1;
        }
        pSVar8 = sqlite3SelectDup(db,*(Select **)((long)p->a + lVar11 + -0x40),flags);
        *(Select **)((long)pSVar5->a + lVar11 + -0x40) = pSVar8;
        pEVar9 = *(Expr **)((long)p->a + lVar11 + -0x20);
        if ((*(byte *)((long)p->a + lVar11 + -0x2a) & 4) == 0) {
          if (pEVar9 == (Expr *)0x0) {
            pEVar9 = (Expr *)0x0;
          }
          else {
            pEVar9 = exprDup(db,pEVar9,flags,(u8 **)0x0);
          }
        }
        else {
          pEVar9 = (Expr *)sqlite3IdListDup(db,(IdList *)pEVar9);
        }
        *(Expr **)((long)pSVar5->a + lVar11 + -0x20) = pEVar9;
        *(undefined8 *)((long)pSVar5->a + lVar11 + -0x18) =
             *(undefined8 *)((long)p->a + lVar11 + -0x18);
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0x68;
      } while (lVar10 < p->nSrc);
      return pSVar5;
    }
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, const SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    SrcItem *pNewItem = &pNew->a[i];
    const SrcItem *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->fg = pOldItem->fg;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }
    pNewItem->u2 = pOldItem->u2;
    if( pNewItem->fg.isCte ){
      pNewItem->u2.pCteUse->nUse++;
    }
    if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg =
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    if( pOldItem->fg.isUsing ){
      assert( pNewItem->fg.isUsing );
      pNewItem->u3.pUsing = sqlite3IdListDup(db, pOldItem->u3.pUsing);
    }else{
      pNewItem->u3.pOn = sqlite3ExprDup(db, pOldItem->u3.pOn, flags);
    }
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}